

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Terrain.cpp
# Opt level: O0

bool loadMeshletVertexArray(void)

{
  GLboolean GVar1;
  GLenum GVar2;
  
  fprintf(_stdout,"Loading {Meshlet-VertexArray}\n");
  fflush(_stdout);
  GVar1 = (*glad_glIsVertexArray)(g_gl.vertexArrays[1]);
  if (GVar1 != '\0') {
    (*glad_glDeleteVertexArrays)(1,g_gl.vertexArrays + 1);
  }
  (*glad_glGenVertexArrays)(1,g_gl.vertexArrays + 1);
  (*glad_glBindVertexArray)(g_gl.vertexArrays[1]);
  (*glad_glEnableVertexAttribArray)(0);
  (*glad_glBindBuffer)(0x8892,g_gl.buffers[3]);
  (*glad_glVertexAttribPointer)(0,2,0x1406,'\0',0,(void *)0x0);
  (*glad_glBindBuffer)(0x8893,g_gl.buffers[4]);
  (*glad_glBindVertexArray)(0);
  GVar2 = (*glad_glGetError)();
  return GVar2 == 0;
}

Assistant:

bool loadMeshletVertexArray()
{
    LOG("Loading {Meshlet-VertexArray}\n");
    if (glIsVertexArray(g_gl.vertexArrays[VERTEXARRAY_MESHLET]))
        glDeleteVertexArrays(1, &g_gl.vertexArrays[VERTEXARRAY_MESHLET]);

    glGenVertexArrays(1, &g_gl.vertexArrays[VERTEXARRAY_MESHLET]);

    glBindVertexArray(g_gl.vertexArrays[VERTEXARRAY_MESHLET]);
    glEnableVertexAttribArray(0);
    glBindBuffer(GL_ARRAY_BUFFER, g_gl.buffers[BUFFER_MESHLET_VERTICES]);
    glVertexAttribPointer(0, 2, GL_FLOAT, 0, 0, BUFFER_OFFSET(0));
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, g_gl.buffers[BUFFER_MESHLET_INDEXES]);
    glBindVertexArray(0);

    return (glGetError() == GL_NO_ERROR);
}